

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_protocol.cpp
# Opt level: O1

void ReadTicCmd(BYTE **stream,int player,int tic)

{
  ushort *data;
  usercmd_t *ucmd;
  ticcmd_t *ptVar1;
  ushort uVar2;
  ushort *puVar3;
  byte bVar4;
  long lVar5;
  usercmd_t *basis;
  long lVar6;
  DWORD DVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  
  lVar6 = (long)player;
  lVar5 = (long)(tic % 0x24);
  puVar3 = (ushort *)*stream;
  uVar2 = *puVar3;
  data = puVar3 + 1;
  *stream = (BYTE *)data;
  *(ushort *)(lVar6 * 0x2d0 + 0xa30490 + lVar5 * 0x14) = uVar2 << 8 | uVar2 >> 8;
  uVar2 = puVar3[1];
  *stream = (BYTE *)((long)puVar3 + 3);
  bVar4 = (byte)uVar2;
  puVar3 = data;
  while (bVar4 - 3 < 0xfffffffe) {
    Net_SkipCommand((uint)bVar4,stream);
    puVar3 = (ushort *)*stream;
    uVar2 = *puVar3;
    *stream = (BYTE *)((long)puVar3 + 1);
    bVar4 = (byte)uVar2;
  }
  ucmd = &netcmds[lVar6][lVar5].ucmd;
  FDynamicBuffer::SetData(NetSpecs[lVar6] + lVar5,(BYTE *)data,(int)puVar3 - (int)data);
  if (bVar4 == 1) {
    if (tic == 0) {
      basis = (usercmd_t *)0x0;
    }
    else {
      basis = &netcmds[lVar6][(tic + -1) % 0x24].ucmd;
    }
    UnpackUserCmd(ucmd,basis,stream);
  }
  else {
    if (tic == 0) {
      DVar7 = 0;
      uVar8 = 0;
      uVar9 = 0;
      uVar10 = 0;
    }
    else {
      ptVar1 = netcmds[lVar6] + (tic + -1) % 0x24;
      DVar7 = (ptVar1->ucmd).buttons;
      uVar8._0_2_ = (ptVar1->ucmd).pitch;
      uVar8._2_2_ = (ptVar1->ucmd).yaw;
      uVar9._0_2_ = (ptVar1->ucmd).roll;
      uVar9._2_2_ = (ptVar1->ucmd).forwardmove;
      uVar10._0_2_ = (ptVar1->ucmd).sidemove;
      uVar10._2_2_ = (ptVar1->ucmd).upmove;
    }
    ucmd->buttons = DVar7;
    ucmd->pitch = (short)uVar8;
    ucmd->yaw = (short)((uint)uVar8 >> 0x10);
    ucmd->roll = (short)uVar9;
    ucmd->forwardmove = (short)((uint)uVar9 >> 0x10);
    ucmd->sidemove = (short)uVar10;
    ucmd->upmove = (short)((uint)uVar10 >> 0x10);
  }
  if (((0x24 < tic) && (consoleplayer == player)) &&
     (consistancy[lVar6][lVar5] != (short)ucmd[1].buttons)) {
    __assert_fail("consistancy[player][ticmod] == tcmd->consistancy",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/d_protocol.cpp"
                  ,0x1bb,"void ReadTicCmd(BYTE **, int, int)");
  }
  return;
}

Assistant:

void ReadTicCmd (BYTE **stream, int player, int tic)
{
	int type;
	BYTE *start;
	ticcmd_t *tcmd;

	int ticmod = tic % BACKUPTICS;

	tcmd = &netcmds[player][ticmod];
	tcmd->consistancy = ReadWord (stream);

	start = *stream;

	while ((type = ReadByte (stream)) != DEM_USERCMD && type != DEM_EMPTYUSERCMD)
		Net_SkipCommand (type, stream);

	NetSpecs[player][ticmod].SetData (start, int(*stream - start - 1));

	if (type == DEM_USERCMD)
	{
		UnpackUserCmd (&tcmd->ucmd,
			tic ? &netcmds[player][(tic-1)%BACKUPTICS].ucmd : NULL, stream);
	}
	else
	{
		if (tic)
		{
			memcpy (&tcmd->ucmd, &netcmds[player][(tic-1)%BACKUPTICS].ucmd, sizeof(tcmd->ucmd));
		}
		else
		{
			memset (&tcmd->ucmd, 0, sizeof(tcmd->ucmd));
		}
	}

	if (player==consoleplayer&&tic>BACKUPTICS)
		assert(consistancy[player][ticmod] == tcmd->consistancy);
}